

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<void_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::AsymetricResizeLock>
::SetNextFreeEntryIndex
          (BaseDictionary<void_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::AsymetricResizeLock>
           *this,EntryType *freeEntry,int nextFreeEntryIndex)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined8 *in_FS_OFFSET;
  
  if ((freeEntry->
      super_DefaultHashedEntry<void_*,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>)
      .super_KeyValueEntry<void_*,_unsigned_long>.
      super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_long>_>
      .super_KeyValueEntryDataLayout2<void_*,_unsigned_long>.next < -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,799,"(!IsFreeEntry(freeEntry))","!IsFreeEntry(freeEntry)");
    if (!bVar3) goto LAB_002a3684;
    *puVar1 = 0;
  }
  if (nextFreeEntryIndex < -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,800,"(nextFreeEntryIndex >= -1)","nextFreeEntryIndex >= -1");
    if (!bVar3) goto LAB_002a3684;
    *puVar1 = 0;
  }
  if (this->count <= nextFreeEntryIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x321,"(nextFreeEntryIndex < count)","nextFreeEntryIndex < count");
    if (!bVar3) {
LAB_002a3684:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  iVar4 = -2 - nextFreeEntryIndex;
  if (nextFreeEntryIndex < 0) {
    iVar4 = -2;
  }
  (freeEntry->
  super_DefaultHashedEntry<void_*,_unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntry>).
  super_KeyValueEntry<void_*,_unsigned_long>.
  super_ValueEntry<unsigned_long,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_long>_>
  .super_KeyValueEntryDataLayout2<void_*,_unsigned_long>.next = iVar4;
  return;
}

Assistant:

void SetNextFreeEntryIndex(EntryType &freeEntry, const int nextFreeEntryIndex)
        {
            Assert(!IsFreeEntry(freeEntry));
            Assert(nextFreeEntryIndex >= -1);
            Assert(nextFreeEntryIndex < count);

            // The last entry in the free list chain will have a next of FreeListSentinel to indicate that it is a free entry. The end of the
            // free list chain is identified using freeCount.
            freeEntry.next = nextFreeEntryIndex >= 0 ? FreeListSentinel - nextFreeEntryIndex : FreeListSentinel;
        }